

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

string * __thiscall
args::NamedBase::GetDefaultString_abi_cxx11_(NamedBase *this,HelpParams *param_2)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  return in_RDI;
}

Assistant:

virtual std::string GetDefaultString(const HelpParams&) const { return {}; }